

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O1

Extra_FileReader_t *
Extra_FileReaderAlloc(char *pFileName,char *pCharsComment,char *pCharsStop,char *pCharsClean)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  Extra_FileReader_t *__s;
  long lVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  byte *pbVar9;
  char *pcVar10;
  int iVar11;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __s = (Extra_FileReader_t *)0x0;
    printf("Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    __s = (Extra_FileReader_t *)malloc(0x158);
    memset(__s,0,0x158);
    __s->pFileName = pFileName;
    __s->pFile = (FILE *)__stream;
    pcVar4 = __s->pCharMap;
    memset(pcVar4,1,0x100);
    bVar1 = *pCharsComment;
    if (bVar1 != 0) {
      pbVar9 = (byte *)(pCharsComment + 1);
      do {
        pcVar4[bVar1] = '\0';
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      } while (bVar1 != 0);
    }
    bVar1 = *pCharsStop;
    if (bVar1 != 0) {
      pbVar9 = (byte *)(pCharsStop + 1);
      do {
        pcVar4[bVar1] = '\x02';
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      } while (bVar1 != 0);
    }
    bVar1 = *pCharsClean;
    if (bVar1 != 0) {
      pbVar9 = (byte *)(pCharsClean + 1);
      do {
        pcVar4[bVar1] = '\x03';
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      } while (bVar1 != 0);
    }
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    iVar11 = (int)lVar3;
    __s->nFileSize = iVar11;
    rewind(__stream);
    pcVar4 = (char *)malloc(0x400001);
    __s->pBuffer = pcVar4;
    __s->nBufferSize = 0x400000;
    __s->pBufferCur = pcVar4;
    iVar2 = 0x400000;
    if (iVar11 < 0x400000) {
      iVar2 = iVar11;
    }
    fread(pcVar4,(long)iVar2,1,(FILE *)__s->pFile);
    __s->nFileRead = iVar2;
    __s->pBufferEnd = pcVar4 + iVar2;
    pcVar10 = pcVar4 + 0x3ff000;
    if (iVar11 < 0x400001) {
      pcVar10 = pcVar4 + iVar2;
    }
    __s->pBufferStop = pcVar10;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    pVVar5->pArray = ppvVar6;
    __s->vTokens = pVVar5;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    __s->vLines = pVVar7;
    __s->nLineCounter = 1;
  }
  return __s;
}

Assistant:

Extra_FileReader_t * Extra_FileReaderAlloc( char * pFileName, 
    char * pCharsComment, char * pCharsStop, char * pCharsClean )
{
    Extra_FileReader_t * p;
    FILE * pFile;
    char * pChar;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Extra_FileReader_t, 1 );
    memset( p, 0, sizeof(Extra_FileReader_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // set the character map
    memset( p->pCharMap, EXTRA_CHAR_NORMAL, 256 );
    for ( pChar = pCharsComment; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_COMMENT;
    for ( pChar = pCharsStop; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_STOP;
    for ( pChar = pCharsClean; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_CLEAN;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, EXTRA_BUFFER_SIZE+1 );
    p->nBufferSize = EXTRA_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = EXTRA_MINIMUM(p->nFileSize, EXTRA_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + EXTRA_BUFFER_SIZE - EXTRA_OFFSET_SIZE;
    // start the arrays
    p->vTokens = Vec_PtrAlloc( 100 );
    p->vLines = Vec_IntAlloc( 100 );
    p->nLineCounter = 1; // 1-based line counting
    return p;
}